

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandDrawSelectedInventory::Draw
          (CommandDrawSelectedInventory *this,SBarInfoMainBlock *block,DSBarInfo *statusBar)

{
  AInventory *pAVar1;
  FTexture *pFVar2;
  double Alpha;
  
  if (this->alternateOnEmpty == true) {
    SBarInfoCommandFlowControl::Draw((SBarInfoCommandFlowControl *)this,block,statusBar);
  }
  pAVar1 = GC::ReadBarrier<AInventory>
                     ((AInventory **)&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvSel);
  if ((pAVar1 == (AInventory *)0x0) || (((byte)level.flags & 2) != 0)) {
    return;
  }
  if ((artiflashTick != 0 & this->artiflash) == 1) {
    pFVar2 = FImageCollection::operator[]
                       (&statusBar->Images,(statusBar->invBarOffset - artiflashTick) + 10);
    DSBarInfo::DrawGraphic
              (statusBar,pFVar2,(this->super_CommandDrawImage).imgx,
               (this->super_CommandDrawImage).imgy,block->xOffset,block->yOffset,block->currentAlpha
               ,block->fullScreenOffsets,
               (bool)(this->super_CommandDrawImage).super_SBarInfoCommandFlowControl.field_0x31,
               false,(this->super_CommandDrawImage).offset);
  }
  else {
    if ((this->itemflash == true) && ((itemflashFade != 0.0 || (NAN(itemflashFade))))) {
      Alpha = itemflashFade * block->currentAlpha;
      pFVar2 = FImageCollection::operator[](&statusBar->Images,statusBar->invBarOffset + 2);
      DSBarInfo::DrawGraphic
                (statusBar,pFVar2,
                 (SBarInfoCoordinate)((int)(this->super_CommandDrawImage).imgx + -8),
                 (SBarInfoCoordinate)((int)(this->super_CommandDrawImage).imgy + 4),block->xOffset,
                 block->yOffset,Alpha,block->fullScreenOffsets,
                 (bool)(this->super_CommandDrawImage).super_SBarInfoCommandFlowControl.field_0x31,
                 false,(this->super_CommandDrawImage).offset);
    }
    CommandDrawImage::Draw(&this->super_CommandDrawImage,block,statusBar);
  }
  if ((this->alwaysShowCounter == false) &&
     (pAVar1 = GC::ReadBarrier<AInventory>
                         ((AInventory **)&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvSel),
     pAVar1->Amount == 1)) {
    return;
  }
  CommandDrawString::Draw(&(this->super_CommandDrawNumber).super_CommandDrawString,block,statusBar);
  return;
}

Assistant:

void	Draw(const SBarInfoMainBlock *block, const DSBarInfo *statusBar)
		{
			if(alternateOnEmpty)
				SBarInfoCommandFlowControl::Draw(block, statusBar);

			if(statusBar->CPlayer->mo->InvSel != NULL && !(level.flags & LEVEL_NOINVENTORYBAR))
			{
				if(artiflash && artiflashTick)
				{
					statusBar->DrawGraphic(statusBar->Images[ARTIFLASH_OFFSET+(4-artiflashTick)], imgx, imgy, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets(),
						translatable, false, offset);
				}
				else
				{
					if(itemflash && itemflashFade != 0)
					{
						double flashAlpha = block->Alpha() * itemflashFade;
						statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgCURSOR], imgx-4, imgy+2, block->XOffset(), block->YOffset(), flashAlpha, block->FullScreenOffsets(),
							translatable, false, offset);
					}
					CommandDrawImage::Draw(block, statusBar);
				}
				if(alwaysShowCounter || statusBar->CPlayer->mo->InvSel->Amount != 1)
					CommandDrawNumber::Draw(block, statusBar);
			}
		}